

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iirdemo.cpp
# Opt level: O3

int main(int param_1,char **param_2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  FILE *pFVar4;
  long lVar5;
  double *pdVar6;
  DirectFormII *pDVar7;
  int i;
  int iVar8;
  double *pdVar9;
  Biquad *__end0_1;
  Biquad *__end0;
  byte bVar10;
  undefined4 extraout_XMM0_Da;
  uint uVar11;
  undefined4 extraout_XMM0_Db;
  double dVar12;
  double dVar13;
  double dVar14;
  SOSCascade<2,_Iir::DirectFormII> cust;
  SOSCascade<3,_Iir::DirectFormII> cust2;
  double coeff [2] [6];
  double coeff2 [3] [6];
  BandStop<4,_Iir::DirectFormII> bsn;
  LowPass<8,_Iir::DirectFormII> f;
  HighPass<8,_Iir::DirectFormII> hp_cheby2;
  LowPass<8,_Iir::DirectFormII> lp_cheby1;
  HighPass local_f98;
  CascadeStages<2,_Iir::DirectFormII> local_f48;
  CascadeStages<3,_Iir::DirectFormII> local_ec8;
  double local_e08 [12];
  double local_da8 [14];
  double adStack_d38 [4];
  undefined1 local_d18 [704];
  double adStack_a58 [3];
  undefined1 local_a40 [832];
  double adStack_700 [3];
  undefined1 local_6e8 [840];
  double adStack_3a0 [3];
  PoleFilter<Iir::ChebyshevI::LowPassBase,_Iir::DirectFormII,_8,_8> local_388;
  
  bVar10 = 0;
  Iir::PoleFilter<Iir::Butterworth::LowPassBase,_Iir::DirectFormII,_8,_8>::PoleFilter
            ((PoleFilter<Iir::Butterworth::LowPassBase,_Iir::DirectFormII,_8,_8> *)local_a40);
  Iir::Butterworth::LowPassBase::setup((LowPassBase *)local_a40,8,0.1);
  pFVar4 = fopen("lp.dat","wt");
  iVar8 = 0;
  do {
    uVar11 = 0x3ff00000;
    if (iVar8 != 10) {
      uVar11 = 0;
    }
    dVar12 = (double)((ulong)uVar11 << 0x20);
    lVar5 = 0x80;
    pdVar6 = (double *)(local_a40 + 0x118);
    do {
      dVar1 = *pdVar6;
      dVar13 = pdVar6[1];
      dVar3 = (dVar12 - *(double *)(local_d18 + lVar5 + 0x2b8) * dVar1) -
              *(double *)((long)adStack_a58 + lVar5) * dVar13;
      dVar12 = *(double *)((long)adStack_a58 + lVar5 + 8);
      dVar14 = *(double *)(local_a40 + lVar5);
      dVar2 = *(double *)((long)adStack_a58 + lVar5 + 0x10);
      pdVar6[1] = dVar1;
      *pdVar6 = dVar3;
      dVar12 = dVar13 * dVar2 + dVar14 * dVar3 + dVar12 * dVar1;
      lVar5 = lVar5 + 0x30;
      pdVar6 = pdVar6 + 2;
    } while (lVar5 != 0x140);
    fprintf(pFVar4,"%e\n");
    iVar8 = iVar8 + 1;
  } while (iVar8 != 1000);
  fclose(pFVar4);
  pFVar4 = fopen("lpf.dat","wt");
  dVar12 = 0.0;
  do {
    Iir::Cascade::response((Cascade *)local_a40,dVar12);
    dVar1 = cabs((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    fprintf(pFVar4,"%e\t%e\n",SUB84(dVar12,0),dVar1);
    dVar12 = dVar12 + 0.01;
  } while (dVar12 < 0.5);
  fclose(pFVar4);
  local_f98.super_RBJbase.super_Biquad.m_a0 = 1.0;
  local_f98.super_RBJbase.super_Biquad.m_a1 = 0.0;
  local_f98.super_RBJbase.super_Biquad.m_a2 = 0.0;
  local_f98.super_RBJbase.super_Biquad.m_b1 = 0.0;
  local_f98.super_RBJbase.super_Biquad.m_b2 = 0.0;
  local_f98.super_RBJbase.super_Biquad.m_b0 = 1.0;
  local_f98.super_RBJbase.state.m_x2 = 0.0;
  local_f98.super_RBJbase.state.m_y2 = 0.0;
  local_f98.super_RBJbase.state.m_x1 = 0.0;
  local_f98.super_RBJbase.state.m_y1 = 0.0;
  Iir::RBJ::HighPass::setupN(&local_f98,0.1,5.0);
  pFVar4 = fopen("hp_rbj.dat","wt");
  iVar8 = 1000;
  do {
    dVar12 = 1.0;
    if (iVar8 != 0x3de) {
      dVar12 = 0.0;
    }
    dVar14 = local_f98.super_RBJbase.super_Biquad.m_b1 * local_f98.super_RBJbase.state.m_x1;
    dVar1 = local_f98.super_RBJbase.super_Biquad.m_b2 * local_f98.super_RBJbase.state.m_x2;
    dVar13 = local_f98.super_RBJbase.super_Biquad.m_a2 * local_f98.super_RBJbase.state.m_y2;
    local_f98.super_RBJbase.state.m_x2 = local_f98.super_RBJbase.state.m_x1;
    local_f98.super_RBJbase.state.m_y2 = local_f98.super_RBJbase.state.m_y1;
    local_f98.super_RBJbase.state.m_x1 = dVar12;
    local_f98.super_RBJbase.state.m_y1 =
         ((dVar1 + local_f98.super_RBJbase.super_Biquad.m_b0 * dVar12 + dVar14) -
         local_f98.super_RBJbase.state.m_y1 * local_f98.super_RBJbase.super_Biquad.m_a1) - dVar13;
    fprintf(pFVar4,"%e\n");
    iVar8 = iVar8 + -1;
  } while (iVar8 != 0);
  fclose(pFVar4);
  Iir::PoleFilter<Iir::ChebyshevI::LowPassBase,_Iir::DirectFormII,_8,_8>::PoleFilter(&local_388);
  Iir::ChebyshevI::LowPassBase::setup(&local_388.super_LowPassBase,8,0.1,1.0);
  pFVar4 = fopen("lp_cheby1.dat","wt");
  iVar8 = 0;
  do {
    uVar11 = 0x3ff00000;
    if (iVar8 != 10) {
      uVar11 = 0;
    }
    dVar12 = (double)((ulong)uVar11 << 0x20);
    lVar5 = 0x88;
    pDVar7 = local_388.super_CascadeStages<4,_Iir::DirectFormII>.m_states;
    do {
      dVar1 = pDVar7->m_v1;
      dVar13 = pDVar7->m_v2;
      dVar3 = (dVar12 - *(double *)(local_6e8 + lVar5 + 0x340) * dVar1) -
              *(double *)((long)adStack_3a0 + lVar5) * dVar13;
      dVar12 = *(double *)((long)adStack_3a0 + lVar5 + 8);
      dVar14 = *(double *)
                ((long)(local_388.super_CascadeStages<4,_Iir::DirectFormII>.m_stages + -2) + lVar5);
      dVar2 = *(double *)((long)adStack_3a0 + lVar5 + 0x10);
      pDVar7->m_v2 = dVar1;
      pDVar7->m_v1 = dVar3;
      dVar12 = dVar13 * dVar2 + dVar14 * dVar3 + dVar12 * dVar1;
      lVar5 = lVar5 + 0x30;
      pDVar7 = pDVar7 + 1;
    } while (lVar5 != 0x148);
    fprintf(pFVar4,"%e\n");
    iVar8 = iVar8 + 1;
  } while (iVar8 != 1000);
  fclose(pFVar4);
  Iir::PoleFilter<Iir::ChebyshevII::HighPassBase,_Iir::DirectFormII,_8,_8>::PoleFilter
            ((PoleFilter<Iir::ChebyshevII::HighPassBase,_Iir::DirectFormII,_8,_8> *)local_6e8);
  Iir::ChebyshevII::HighPassBase::setup((HighPassBase *)local_6e8,8,0.1,60.0);
  pFVar4 = fopen("hp_cheby2.dat","wt");
  iVar8 = 0;
  do {
    uVar11 = 0x3ff00000;
    if (iVar8 != 10) {
      uVar11 = 0;
    }
    dVar12 = (double)((ulong)uVar11 << 0x20);
    lVar5 = 0x88;
    pdVar6 = (double *)(local_6e8 + 0x120);
    do {
      dVar1 = *pdVar6;
      dVar13 = pdVar6[1];
      dVar3 = (dVar12 - *(double *)(local_a40 + lVar5 + 0x338) * dVar1) -
              *(double *)((long)adStack_700 + lVar5) * dVar13;
      dVar12 = *(double *)((long)adStack_700 + lVar5 + 8);
      dVar14 = *(double *)(local_6e8 + lVar5);
      dVar2 = *(double *)((long)adStack_700 + lVar5 + 0x10);
      pdVar6[1] = dVar1;
      *pdVar6 = dVar3;
      dVar12 = dVar13 * dVar2 + dVar14 * dVar3 + dVar12 * dVar1;
      lVar5 = lVar5 + 0x30;
      pdVar6 = pdVar6 + 2;
    } while (lVar5 != 0x148);
    fprintf(pFVar4,"%e\n");
    iVar8 = iVar8 + 1;
  } while (iVar8 != 1000);
  fclose(pFVar4);
  Iir::PoleFilter<Iir::Butterworth::BandStopBase,_Iir::DirectFormII,_4,_8>::PoleFilter
            ((PoleFilter<Iir::Butterworth::BandStopBase,_Iir::DirectFormII,_4,_8> *)local_d18);
  Iir::Butterworth::BandStopBase::setup((BandStopBase *)local_d18,4,0.1,0.01);
  pFVar4 = fopen("bs_norm.dat","wt");
  iVar8 = 0;
  do {
    uVar11 = 0x3ff00000;
    if (iVar8 != 10) {
      uVar11 = 0;
    }
    dVar12 = (double)((ulong)uVar11 << 0x20);
    lVar5 = 0x80;
    pdVar6 = (double *)(local_d18 + 0x118);
    do {
      dVar1 = *pdVar6;
      dVar13 = pdVar6[1];
      dVar3 = (dVar12 - *(double *)((long)adStack_d38 + lVar5) * dVar1) -
              *(double *)((long)adStack_d38 + lVar5 + 8) * dVar13;
      dVar12 = *(double *)((long)adStack_d38 + lVar5 + 0x10);
      dVar14 = *(double *)(local_d18 + lVar5);
      dVar2 = *(double *)((long)adStack_d38 + lVar5 + 0x18);
      pdVar6[1] = dVar1;
      *pdVar6 = dVar3;
      dVar12 = dVar13 * dVar2 + dVar14 * dVar3 + dVar12 * dVar1;
      lVar5 = lVar5 + 0x30;
      pdVar6 = pdVar6 + 2;
    } while (lVar5 != 0x140);
    fprintf(pFVar4,"%e\n");
    iVar8 = iVar8 + 1;
  } while (iVar8 != 1000);
  fclose(pFVar4);
  pdVar6 = (double *)&DAT_00108100;
  pdVar9 = local_e08;
  for (lVar5 = 0xc; lVar5 != 0; lVar5 = lVar5 + -1) {
    *pdVar9 = *pdVar6;
    pdVar6 = pdVar6 + (ulong)bVar10 * -2 + 1;
    pdVar9 = pdVar9 + (ulong)bVar10 * -2 + 1;
  }
  lVar5 = 0;
  do {
    *(undefined8 *)((long)&local_f48.m_stages[0].m_a0 + lVar5) = 0x3ff0000000000000;
    *(undefined8 *)((long)&local_f48.m_stages[0].m_a1 + lVar5) = 0;
    *(undefined8 *)((long)&local_f48.m_stages[0].m_a2 + lVar5) = 0;
    *(undefined8 *)((long)&local_f48.m_stages[0].m_b1 + lVar5) = 0;
    *(undefined8 *)((long)&local_f48.m_stages[0].m_b2 + lVar5) = 0;
    *(undefined8 *)((long)&local_f48.m_stages[0].m_b0 + lVar5) = 0x3ff0000000000000;
    lVar5 = lVar5 + 0x30;
  } while (lVar5 != 0x60);
  local_f48.m_states[1].m_v1 = 0.0;
  local_f48.m_states[1].m_v2 = 0.0;
  local_f48.m_states[0].m_v1 = 0.0;
  local_f48.m_states[0].m_v2 = 0.0;
  Iir::CascadeStages<2,_Iir::DirectFormII>::setup(&local_f48,(double (*) [2] [6])local_e08);
  pFVar4 = fopen("ellip.dat","wt");
  iVar8 = 0;
  do {
    uVar11 = 0x3ff00000;
    if (iVar8 != 10) {
      uVar11 = 0;
    }
    dVar12 = (double)((ulong)uVar11 << 0x20);
    lVar5 = 0x28;
    pDVar7 = local_f48.m_states;
    do {
      dVar1 = pDVar7->m_v1;
      dVar13 = pDVar7->m_v2;
      dVar3 = (dVar12 - *(double *)((long)local_f48.m_stages + lVar5 + -0x20) * dVar1) -
              *(double *)((long)local_f48.m_stages + lVar5 + -0x18) * dVar13;
      dVar12 = *(double *)((long)local_f48.m_stages + lVar5 + -0x10);
      dVar14 = *(double *)((long)&local_f48.m_stages[0].m_a0 + lVar5);
      dVar2 = *(double *)((long)local_f48.m_stages + lVar5 + -8);
      pDVar7->m_v2 = dVar1;
      pDVar7->m_v1 = dVar3;
      dVar12 = dVar13 * dVar2 + dVar14 * dVar3 + dVar12 * dVar1;
      lVar5 = lVar5 + 0x30;
      pDVar7 = pDVar7 + 1;
    } while (lVar5 != 0x88);
    fprintf(pFVar4,"%e\n");
    iVar8 = iVar8 + 1;
  } while (iVar8 != 1000);
  fclose(pFVar4);
  memcpy(local_da8,&DAT_00108160,0x90);
  lVar5 = 0;
  do {
    *(undefined8 *)((long)&local_ec8.m_stages[0].m_a0 + lVar5) = 0x3ff0000000000000;
    *(undefined8 *)((long)&local_ec8.m_stages[0].m_a1 + lVar5) = 0;
    *(undefined8 *)((long)&local_ec8.m_stages[0].m_a2 + lVar5) = 0;
    *(undefined8 *)((long)&local_ec8.m_stages[0].m_b1 + lVar5) = 0;
    *(undefined8 *)((long)&local_ec8.m_stages[0].m_b2 + lVar5) = 0;
    *(undefined8 *)((long)&local_ec8.m_stages[0].m_b0 + lVar5) = 0x3ff0000000000000;
    lVar5 = lVar5 + 0x30;
  } while (lVar5 != 0x90);
  local_ec8.m_states[2].m_v1 = 0.0;
  local_ec8.m_states[2].m_v2 = 0.0;
  local_ec8.m_states[1].m_v1 = 0.0;
  local_ec8.m_states[1].m_v2 = 0.0;
  local_ec8.m_states[0].m_v1 = 0.0;
  local_ec8.m_states[0].m_v2 = 0.0;
  Iir::CascadeStages<3,_Iir::DirectFormII>::setup(&local_ec8,(double (*) [3] [6])local_da8);
  pFVar4 = fopen("bessel.dat","wt");
  iVar8 = 0;
  do {
    uVar11 = 0x3ff00000;
    if (iVar8 != 10) {
      uVar11 = 0;
    }
    dVar12 = (double)((ulong)uVar11 << 0x20);
    lVar5 = 0x28;
    pDVar7 = local_ec8.m_states;
    do {
      dVar1 = pDVar7->m_v1;
      dVar13 = pDVar7->m_v2;
      dVar3 = (dVar12 - *(double *)((long)&local_f48.m_states[0].m_v1 + lVar5) * dVar1) -
              *(double *)((long)&local_f48.m_states[0].m_v2 + lVar5) * dVar13;
      dVar12 = *(double *)((long)&local_f48.m_states[1].m_v1 + lVar5);
      dVar14 = *(double *)((long)&local_ec8.m_stages[0].m_a0 + lVar5);
      dVar2 = *(double *)((long)local_ec8.m_stages + lVar5 + -8);
      pDVar7->m_v2 = dVar1;
      pDVar7->m_v1 = dVar3;
      dVar12 = dVar13 * dVar2 + dVar14 * dVar3 + dVar12 * dVar1;
      lVar5 = lVar5 + 0x30;
      pDVar7 = pDVar7 + 1;
    } while (lVar5 != 0xb8);
    fprintf(pFVar4,"%e\n");
    iVar8 = iVar8 + 1;
  } while (iVar8 != 1000);
  fclose(pFVar4);
  puts("finished!");
  puts("Now run `plot_impulse_fresponse.py` to display the impulse/frequency responses.");
  return 0;
}

Assistant:

int main(int, char**)
{
	const int order = 8;

	// sampling rate here 1kHz as an example
	const float samplingrate = 1000;

	FILE *fimpulse = NULL;

	// Butterworth lowpass
	Iir::Butterworth::LowPass<order> f;
	double cutoff_frequency = 100; // Hz
	f.setup(samplingrate, cutoff_frequency);
	fimpulse = fopen("lp.dat", "wt");
	// let's simulated date streaming in
	for (int i = 0; i < 1000; i++)
	{
		double a = 0;
		if (i == 10) a = 1;
		double b = f.filter(a);
		fprintf(fimpulse, "%e\n", b);
	}
	fclose(fimpulse);
	FILE* fresp = fopen("lpf.dat", "wt");
	for(double fr=0.0;fr<0.5;fr=fr+0.01) {
		auto r = f.response(fr);
		fprintf(fresp,"%e\t%e\n",fr,abs(r));
	}
	fclose(fresp);

	// RBJ highpass filter
	// The Q factor determines the resonance at the
	// cutoff frequency. If Q=1/sqrt(2) then the transition
	// has no resonance. The higher the Q-factor the higher
	// the resonance.
	Iir::RBJ::HighPass hp;
	const double hp_cutoff_frequency = 100;
	const double hp_qfactor = 5;
	hp.setup(samplingrate, hp_cutoff_frequency, hp_qfactor);
	fimpulse = fopen("hp_rbj.dat", "wt");
	for (int i = 0; i < 1000; i++)
	{
		double a = 0;
		if (i == 10) a = 1;
		double b = hp.filter(a);
		fprintf(fimpulse, "%e\n", b);
	}
	fclose(fimpulse);

	Iir::ChebyshevI::LowPass<8> lp_cheby1;
	const float pass_ripple_db2 = 1; // dB
	lp_cheby1.setup(samplingrate,
		cutoff_frequency,
		pass_ripple_db2);
	fimpulse = fopen("lp_cheby1.dat", "wt");
	for (int i = 0; i < 1000; i++)
	{
		double a = 0;
		if (i == 10) a = 1;
		double b = lp_cheby1.filter(a);
		fprintf(fimpulse, "%e\n", b);
	}
	fclose(fimpulse);

	// Demo here if one has a pure digital
	// system one can use normalised
	// frequencies from 0 to 1/2 (Nyquist)
	// where the frequency is 1/samples.
	Iir::ChebyshevII::HighPass<order> hp_cheby2;
	double stop_ripple_dB = 60;
	// Setting cutoff to normalised f=0.1
	double normalised_cutoff_freq = 0.1;
	hp_cheby2.setupN(normalised_cutoff_freq,
		stop_ripple_dB);
	fimpulse = fopen("hp_cheby2.dat", "wt");
	for (int i = 0; i < 1000; i++)
	{
		double a = 0;
		if (i == 10) a = 1;
		double b = hp_cheby2.filter(a);
		fprintf(fimpulse, "%e\n", b);
	}
	fclose(fimpulse);

	// Bandstop filter with default order
	Iir::Butterworth::BandStop<> bsn;
	const double norm_center_frequency = 0.1;
	const double norm_frequency_width = 0.01;
	bsn.setupN(norm_center_frequency, norm_frequency_width);
	fimpulse = fopen("bs_norm.dat", "wt");
	for (int i = 0; i < 1000; i++)
	{
		double a = 0;
		if (i == 10) a = 1;
		double b = bsn.filter(a);
		fprintf(fimpulse, "%e\n", b);
	}
	fclose(fimpulse);

	// generated with: "elliptic_design.py"
	const double coeff[][6] = {
		{1.665623674062209972e-02,
		 -3.924801366970616552e-03,
		 1.665623674062210319e-02,
		 1.000000000000000000e+00,
		 -1.715403014004022175e+00,
		 8.100474793174089472e-01},
		{1.000000000000000000e+00,
		 -1.369778997100624895e+00,
		 1.000000000000000222e+00,
		 1.000000000000000000e+00,
		 -1.605878925999785656e+00,
		 9.538657786383895054e-01}
	};
	const int nSOS = sizeof(coeff) / sizeof(coeff[0]);
	Iir::Custom::SOSCascade<nSOS> cust(coeff);
	fimpulse = fopen("ellip.dat", "wt");
	for (int i = 0; i < 1000; i++)
	{
		double a = 0;
		if (i == 10) a = 1;
		double b = cust.filter(a);
		fprintf(fimpulse, "%e\n", b);
	}
	fclose(fimpulse);



	// generated with: "bessel_design.py"
	const double coeff2[][6] = {
{2.920503346420688542e-04,5.841006692841377084e-04,2.920503346420688542e-04,1.000000000000000000e+00,-1.080977903549440899e+00,2.972760361591921807e-01},
{1.000000000000000000e+00,2.000000000000000000e+00,1.000000000000000000e+00,1.000000000000000000e+00,-1.109677060197390652e+00,3.586665760324884156e-01},
{1.000000000000000000e+00,2.000000000000000000e+00,1.000000000000000000e+00,1.000000000000000000e+00,-1.179438547708672624e+00,5.264979795433866183e-01},
	};
	const int nSOS2 = sizeof(coeff2) / sizeof(coeff2[0]);
	Iir::Custom::SOSCascade<nSOS2> cust2(coeff2);
	fimpulse = fopen("bessel.dat", "wt");
	for (int i = 0; i < 1000; i++)
	{
		double a = 0;
		if (i == 10) a = 1;
		double b = cust2.filter(a);
		fprintf(fimpulse, "%e\n", b);
	}
	fclose(fimpulse);



	printf("finished!\n");
	printf("Now run `plot_impulse_fresponse.py` to display the impulse/frequency responses.\n");
}